

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O2

sync_edges_t * __thiscall
tchecker::syncprod::vloc_edges_iterator_t::operator*
          (sync_edges_t *__return_storage_ptr__,vloc_edges_iterator_t *this)

{
  synchronization_t *psVar1;
  synchronization_t *psVar2;
  edges_iterator_t end;
  edges_iterator_t begin;
  sync_edges_t sync_edges;
  
  psVar1 = (this->_sync_it)._sync_it._M_current;
  psVar2 = (this->_sync_it)._sync_end._M_current;
  if ((psVar1 == psVar2) &&
     ((this->_async_it)._it.super_type.m_iterator == (this->_async_it)._end.super_type.m_iterator))
  {
    __assert_fail("!at_end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/edges_iterators.cc"
                  ,0xdc,
                  "vloc_edges_iterator_t::sync_edges_t tchecker::syncprod::vloc_edges_iterator_t::operator*()"
                 );
  }
  if (psVar1 == psVar2) {
    join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
    ::operator*((join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
                 *)&end);
    edges_iterator_t::edges_iterator_t(&begin,&end._async_edge,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&end._async_edge.
                super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
    ::operator*((join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
                 *)&sync_edges);
    edges_iterator_t::edges_iterator_t(&end,(edge_const_shared_ptr_t *)&sync_edges,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_edges.edges);
    __return_storage_ptr__->sync_id = 0xffffffff;
  }
  else {
    vloc_synchronized_edges_iterator_t::operator*(&sync_edges,&this->_sync_it);
    begin._async_at_end = false;
    begin._async_edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    begin._async_edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    begin._sync_it._it._M_current = sync_edges.edges._begin._it._M_current;
    end._async_at_end = false;
    end._async_edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    end._async_edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    end._sync_it._it._M_current = sync_edges.edges._end._it._M_current;
    __return_storage_ptr__->sync_id = sync_edges.sync_id;
  }
  range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::range_t
            (&__return_storage_ptr__->edges,&begin,&end);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&end._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&begin._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

vloc_edges_iterator_t::sync_edges_t vloc_edges_iterator_t::operator*()
{
  assert(!at_end());

  if (_sync_it != tchecker::past_the_end_iterator) {
    tchecker::syncprod::vloc_synchronized_edges_iterator_t::sync_edges_t sync_edges = *_sync_it;
    tchecker::syncprod::edges_iterator_t begin(sync_edges.edges.begin()), end(sync_edges.edges.end());
    return tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t{.sync_id = sync_edges.sync_id,
                                                                   .edges = tchecker::make_range(begin, end)};
  }

  tchecker::syncprod::edges_iterator_t begin(*_async_it, false), end(*_async_it, true);
  return tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t{.sync_id = tchecker::NO_SYNC,
                                                                 .edges = tchecker::make_range(begin, end)};
}